

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

float __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::getAttributeValueAsFloat
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,char *name)

{
  SAttribute *pSVar1;
  float fVar2;
  double dVar3;
  stringc c;
  string<char> local_18;
  
  pSVar1 = getAttributeByName(this,name);
  if (pSVar1 == (SAttribute *)0x0) {
    fVar2 = 0.0;
  }
  else {
    core::string<char>::string<char>(&local_18,(pSVar1->Value).array);
    dVar3 = atof(local_18.array);
    fVar2 = (float)dVar3;
    core::string<char>::~string(&local_18);
  }
  return fVar2;
}

Assistant:

float getAttributeValueAsFloat(const char_type* name) const
	{
		const SAttribute* attr = getAttributeByName(name);
		if (!attr)
			return 0;

		core::stringc c = attr->Value.c_str();
        return static_cast<float>(atof(c.c_str()));
        //return fast_atof(c.c_str());
	}